

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O2

void __thiscall despot::POMDPX::InitRewards(POMDPX *this)

{
  double dVar1;
  pointer pvVar2;
  long lVar3;
  pointer ppPVar4;
  int iVar5;
  undefined4 extraout_var;
  long lVar6;
  int i;
  ulong uVar7;
  ulong uVar8;
  int a;
  ulong uVar9;
  double dVar10;
  
  if (this->is_small_ != false) {
    iVar5 = (*(this->super_MDP)._vptr_MDP[2])();
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(&this->rewards_,(long)iVar5);
    uVar8 = 0;
    while( true ) {
      iVar5 = (*(this->super_MDP)._vptr_MDP[2])(this);
      if ((long)iVar5 <= (long)uVar8) break;
      pvVar2 = (this->rewards_).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar5 = (*(this->super_MDP)._vptr_MDP[3])(this);
      std::vector<double,_std::allocator<double>_>::resize(pvVar2 + uVar8,(long)iVar5);
      uVar9 = 0;
      while( true ) {
        iVar5 = (*(this->super_MDP)._vptr_MDP[3])(this);
        if ((long)iVar5 <= (long)uVar9) break;
        *(undefined8 *)
         (*(long *)&(this->rewards_).
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar8].
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data + uVar9 * 8) = 0;
        iVar5 = (*(this->super_MDP)._vptr_MDP[4])(this,uVar8 & 0xffffffff,uVar9 & 0xffffffff);
        lVar6 = 0x18;
        for (uVar7 = 0; lVar3 = *(long *)CONCAT44(extraout_var,iVar5),
            uVar7 < (ulong)(((long *)CONCAT44(extraout_var,iVar5))[1] - lVar3 >> 5);
            uVar7 = uVar7 + 1) {
          dVar1 = *(double *)(lVar3 + lVar6);
          ppPVar4 = (this->states_).
                    super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          dVar10 = Parser::GetReward(this->parser_,&ppPVar4[uVar8]->vec_id,
                                     &ppPVar4[*(int *)(lVar3 + -0xc + lVar6)]->vec_id,
                                     (ACT_TYPE)uVar9);
          lVar3 = *(long *)&(this->rewards_).
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar8].
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data;
          *(double *)(lVar3 + uVar9 * 8) = dVar10 * dVar1 + *(double *)(lVar3 + uVar9 * 8);
          lVar6 = lVar6 + 0x20;
        }
        uVar9 = uVar9 + 1;
      }
      uVar8 = uVar8 + 1;
    }
    return;
  }
  __assert_fail("is_small_",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/pomdpx/pomdpx.cpp"
                ,0x163,"void despot::POMDPX::InitRewards()");
}

Assistant:

void POMDPX::InitRewards() {
	assert(is_small_);

	rewards_.resize(NumStates());

	for (int s = 0; s < NumStates(); s++) {
		rewards_[s].resize(NumActions());
		for (int a = 0; a < NumActions(); a++) {
			rewards_[s][a] = 0.0;
			const vector<State>& transition = TransitionProbability(s, a);
			for (int i = 0; i< transition.size(); i++) {
				const State& next = transition[i];
				rewards_[s][a] += next.weight
					* parser_->GetReward(states_[s]->vec_id,
						states_[next.state_id]->vec_id, a);
			}
		}
	}
}